

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void SHA256_Update_Y(SHA256_CTX_Y *ctx,void *in,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong in_RDX;
  void *in_RSI;
  SHA256_CTX *in_RDI;
  uchar *src;
  uint32_t r;
  uint32_t bitlen [2];
  uchar *local_30;
  ulong local_18;
  
  uVar1 = in_RDI->Nh >> 3 & 0x3f;
  uVar2 = (int)in_RDX * 8;
  uVar3 = uVar2 + in_RDI->Nh;
  in_RDI->Nh = uVar3;
  if (uVar3 < uVar2) {
    in_RDI->Nl = in_RDI->Nl + 1;
  }
  in_RDI->Nl = (int)(in_RDX >> 0x1d) + in_RDI->Nl;
  if (in_RDX < 0x40 - uVar1) {
    memcpy((void *)((long)in_RDI->data + (ulong)uVar1),in_RSI,in_RDX);
  }
  else {
    memcpy((void *)((long)in_RDI->data + (ulong)uVar1),in_RSI,(ulong)(0x40 - uVar1));
    SHA256_Transform(in_RDI,(uchar *)in_RDI->data);
    local_30 = (uchar *)((long)in_RSI + (ulong)(0x40 - uVar1));
    for (local_18 = in_RDX - (0x40 - uVar1); 0x3f < local_18; local_18 = local_18 - 0x40) {
      SHA256_Transform(in_RDI,local_30);
      local_30 = local_30 + 0x40;
    }
    memcpy(in_RDI->data,local_30,local_18);
  }
  return;
}

Assistant:

void
SHA256_Update_Y(SHA256_CTX_Y * ctx, const void *in, size_t len)
{
	uint32_t bitlen[2];
	uint32_t r;
	const unsigned char *src = in;

	/* Number of bytes left in the buffer from previous updates */
	r = (ctx->count[1] >> 3) & 0x3f;

	/* Convert the length into a number of bits */
	bitlen[1] = ((uint32_t)len) << 3;
	bitlen[0] = (uint32_t)(len >> 29);

	/* Update number of bits */
	if ((ctx->count[1] += bitlen[1]) < bitlen[1])
		ctx->count[0]++;
	ctx->count[0] += bitlen[0];

	/* Handle the case where we don't need to perform any transforms */
	if (len < 64 - r) {
		memcpy(&ctx->buf[r], src, len);
		return;
	}

	/* Finish the current block */
	memcpy(&ctx->buf[r], src, 64 - r);
	SHA256_Transform(ctx->state, ctx->buf);
	src += 64 - r;
	len -= 64 - r;

	/* Perform complete blocks */
	while (len >= 64) {
		SHA256_Transform(ctx->state, src);
		src += 64;
		len -= 64;
	}

	/* Copy left over data into buffer */
	memcpy(ctx->buf, src, len);
}